

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_simplifier.cc
# Opt level: O0

bool __thiscall
S2PolylineSimplifier::AvoidDisc
          (S2PolylineSimplifier *this,S2Point *p,S1ChordAngle r,bool disc_on_left)

{
  bool bVar1;
  double dVar2;
  double lo;
  S1Interval SVar3;
  double local_a0;
  S1Interval local_90;
  Vector2_d local_80;
  undefined1 local_70 [8];
  S1Interval target;
  double opposite;
  double center;
  VType local_48;
  double semiwidth;
  bool disc_on_left_local;
  S2Point *p_local;
  S2PolylineSimplifier *this_local;
  S1ChordAngle r_local;
  
  dVar2 = GetSemiwidth(this,p,r,1);
  if (dVar2 < 3.141592653589793) {
    lo = GetAngle(this,p);
    if (lo <= 0.0) {
      local_a0 = lo + 3.141592653589793;
    }
    else {
      local_a0 = lo - 3.141592653589793;
    }
    target.bounds_.c_[1] = local_a0;
    if (disc_on_left) {
      S1Interval::S1Interval((S1Interval *)local_70,local_a0,lo);
    }
    else {
      S1Interval::S1Interval((S1Interval *)local_70,lo,local_a0);
    }
    local_90 = S1Interval::Expanded((S1Interval *)local_70,-dVar2);
    local_80.c_ = (VType  [2])S1Interval::Intersection(&this->window_,&local_90);
    (this->window_).bounds_.c_[0] = local_80.c_[0];
    (this->window_).bounds_.c_[1] = local_80.c_[1];
    bVar1 = S1Interval::is_empty(&this->window_);
    r_local.length2_._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    SVar3 = S1Interval::Empty();
    center = SVar3.bounds_.c_[0];
    (this->window_).bounds_.c_[0] = center;
    local_48 = SVar3.bounds_.c_[1];
    (this->window_).bounds_.c_[1] = local_48;
    r_local.length2_._7_1_ = false;
  }
  return r_local.length2_._7_1_;
}

Assistant:

bool S2PolylineSimplifier::AvoidDisc(const S2Point& p, S1ChordAngle r,
                                     bool disc_on_left) {
  // Expand the interval by the maximum error from all sources.  This
  // guarantees that the final output edge will avoid the given disc.
  double semiwidth = GetSemiwidth(p, r, 1 /*round up*/);
  if (semiwidth >= M_PI) {
    // The avoidance disc contains "src", so it is impossible to avoid.
    window_ = S1Interval::Empty();
    return false;
  }
  double center = GetAngle(p);
  double opposite = (center > 0) ? center - M_PI : center + M_PI;
  S1Interval target = (disc_on_left ? S1Interval(opposite, center) :
                       S1Interval(center, opposite));
  window_ = window_.Intersection(target.Expanded(-semiwidth));
  return !window_.is_empty();
}